

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O2

void __thiscall
cbtHashMap<cbtHashPtr,_cbtCollisionObject_*>::insert
          (cbtHashMap<cbtHashPtr,_cbtCollisionObject_*> *this,cbtHashPtr *key,
          cbtCollisionObject **value)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = cbtHashPtr::getHash(key);
  iVar1 = (this->m_valueArray).m_capacity;
  iVar5 = findIndex(this,key);
  if (iVar5 == -1) {
    iVar5 = (this->m_valueArray).m_size;
    iVar2 = (this->m_valueArray).m_capacity;
    cbtAlignedObjectArray<cbtCollisionObject_*>::push_back(&this->m_valueArray,value);
    cbtAlignedObjectArray<cbtHashPtr>::push_back(&this->m_keyArray,key);
    if (iVar2 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar4 = cbtHashPtr::getHash(key);
      uVar4 = (this->m_valueArray).m_capacity - 1U & uVar4;
    }
    else {
      uVar4 = iVar1 - 1U & uVar4;
    }
    piVar3 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar5] = piVar3[(int)uVar4];
    piVar3[(int)uVar4] = iVar5;
  }
  else {
    (this->m_valueArray).m_data[iVar5] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		int hash = key.getHash() & (m_valueArray.capacity() - 1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index] = value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity() - 1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}